

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_generated.h
# Opt level: O3

Offset<MyGame::Example::Monster>
MyGame::Example::CreateMonster
          (FlatBufferBuilder *_fbb,Vec3 *pos,int16_t mana,int16_t hp,
          Offset<flatbuffers::String> name,
          Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> inventory,Color color,
          Any test_type,Offset<void> test,
          Offset<flatbuffers::Vector<const_MyGame::Example::Test_*,_unsigned_int>_> test4,
          Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_>
          testarrayofstring,
          Offset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Example::Monster>,_unsigned_int>_>
          testarrayoftables,Offset<MyGame::Example::Monster> enemy,
          Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> testnestedflatbuffer,
          Offset<MyGame::Example::Stat> testempty,bool testbool,int32_t testhashs32_fnv1,
          uint32_t testhashu32_fnv1,int64_t testhashs64_fnv1,uint64_t testhashu64_fnv1,
          int32_t testhashs32_fnv1a,uint32_t testhashu32_fnv1a,int64_t testhashs64_fnv1a,
          uint64_t testhashu64_fnv1a,
          Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> testarrayofbools,float testf,
          float testf2,float testf3,
          Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_>
          testarrayofstring2,
          Offset<flatbuffers::Vector<const_MyGame::Example::Ability_*,_unsigned_int>_>
          testarrayofsortedstruct,Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> flex,
          Offset<flatbuffers::Vector<const_MyGame::Example::Test_*,_unsigned_int>_> test5,
          Offset<flatbuffers::Vector<long,_unsigned_int>_> vector_of_longs,
          Offset<flatbuffers::Vector<double,_unsigned_int>_> vector_of_doubles,
          Offset<MyGame::InParentNamespace> parent_namespace_test,
          Offset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Example::Referrable>,_unsigned_int>_>
          vector_of_referrables,uint64_t single_weak_reference,
          Offset<flatbuffers::Vector<unsigned_long,_unsigned_int>_> vector_of_weak_references,
          Offset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Example::Referrable>,_unsigned_int>_>
          vector_of_strong_referrables,uint64_t co_owning_reference,
          Offset<flatbuffers::Vector<unsigned_long,_unsigned_int>_> vector_of_co_owning_references,
          uint64_t non_owning_reference,
          Offset<flatbuffers::Vector<unsigned_long,_unsigned_int>_> vector_of_non_owning_references,
          AnyUniqueAliases any_unique_type,Offset<void> any_unique,
          AnyAmbiguousAliases any_ambiguous_type,Offset<void> any_ambiguous,
          Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> vector_of_enums,Race signed_enum
          ,Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> testrequirednestedflatbuffer,
          Offset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Example::Stat>,_unsigned_int>_>
          scalar_key_sorted_tables,Test *native_inline,LongEnum long_enum_non_enum_default,
          LongEnum long_enum_normal_default,float nan_default,float inf_default,
          float positive_inf_default,float infinity_default,float positive_infinity_default,
          float negative_inf_default,float negative_infinity_default,double double_inf_default)

{
  uoffset_t start;
  Offset<MyGame::Example::Monster> table;
  
  flatbuffers::FlatBufferBuilderImpl<false>::NotNested(_fbb);
  _fbb->nested = true;
  start = (_fbb->buf_).size_;
  flatbuffers::FlatBufferBuilderImpl<false>::AddElement<double>
            (_fbb,0x7e,double_inf_default,INFINITY);
  flatbuffers::FlatBufferBuilderImpl<false>::AddElement<unsigned_long>
            (_fbb,0x6e,long_enum_normal_default,2);
  flatbuffers::FlatBufferBuilderImpl<false>::AddElement<unsigned_long>
            (_fbb,0x6c,long_enum_non_enum_default,0);
  flatbuffers::FlatBufferBuilderImpl<false>::AddElement<unsigned_long>
            (_fbb,0x56,non_owning_reference,0);
  flatbuffers::FlatBufferBuilderImpl<false>::AddElement<unsigned_long>
            (_fbb,0x52,co_owning_reference,0);
  flatbuffers::FlatBufferBuilderImpl<false>::AddElement<unsigned_long>
            (_fbb,0x4c,single_weak_reference,0);
  flatbuffers::FlatBufferBuilderImpl<false>::AddElement<unsigned_long>
            (_fbb,0x32,testhashu64_fnv1a,0);
  flatbuffers::FlatBufferBuilderImpl<false>::AddElement<long>(_fbb,0x30,testhashs64_fnv1a,0);
  flatbuffers::FlatBufferBuilderImpl<false>::AddElement<unsigned_long>(_fbb,0x2a,testhashu64_fnv1,0)
  ;
  flatbuffers::FlatBufferBuilderImpl<false>::AddElement<long>(_fbb,0x28,testhashs64_fnv1,0);
  flatbuffers::FlatBufferBuilderImpl<false>::AddElement<float>
            (_fbb,0x7c,negative_infinity_default,-INFINITY);
  flatbuffers::FlatBufferBuilderImpl<false>::AddElement<float>
            (_fbb,0x7a,negative_inf_default,-INFINITY);
  flatbuffers::FlatBufferBuilderImpl<false>::AddElement<float>
            (_fbb,0x78,positive_infinity_default,INFINITY);
  flatbuffers::FlatBufferBuilderImpl<false>::AddElement<float>(_fbb,0x76,infinity_default,INFINITY);
  flatbuffers::FlatBufferBuilderImpl<false>::AddElement<float>
            (_fbb,0x74,positive_inf_default,INFINITY);
  flatbuffers::FlatBufferBuilderImpl<false>::AddElement<float>(_fbb,0x72,inf_default,INFINITY);
  flatbuffers::FlatBufferBuilderImpl<false>::AddElement<float>(_fbb,0x70,nan_default,NAN);
  flatbuffers::FlatBufferBuilderImpl<false>::AddStruct<MyGame::Example::Test>
            (_fbb,0x6a,native_inline);
  flatbuffers::FlatBufferBuilderImpl<false>::
  AddOffset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Example::Stat>,unsigned_int>>
            (_fbb,0x68,scalar_key_sorted_tables);
  flatbuffers::FlatBufferBuilderImpl<false>::
  AddOffset<flatbuffers::Vector<unsigned_char,unsigned_int>>(_fbb,0x66,testrequirednestedflatbuffer)
  ;
  flatbuffers::FlatBufferBuilderImpl<false>::
  AddOffset<flatbuffers::Vector<unsigned_char,unsigned_int>>(_fbb,0x62,vector_of_enums);
  flatbuffers::FlatBufferBuilderImpl<false>::AddOffset<void>(_fbb,0x60,any_ambiguous);
  flatbuffers::FlatBufferBuilderImpl<false>::AddOffset<void>(_fbb,0x5c,any_unique);
  flatbuffers::FlatBufferBuilderImpl<false>::
  AddOffset<flatbuffers::Vector<unsigned_long,unsigned_int>>
            (_fbb,0x58,vector_of_non_owning_references);
  flatbuffers::FlatBufferBuilderImpl<false>::
  AddOffset<flatbuffers::Vector<unsigned_long,unsigned_int>>
            (_fbb,0x54,vector_of_co_owning_references);
  flatbuffers::FlatBufferBuilderImpl<false>::
  AddOffset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Example::Referrable>,unsigned_int>>
            (_fbb,0x50,vector_of_strong_referrables);
  flatbuffers::FlatBufferBuilderImpl<false>::
  AddOffset<flatbuffers::Vector<unsigned_long,unsigned_int>>(_fbb,0x4e,vector_of_weak_references);
  flatbuffers::FlatBufferBuilderImpl<false>::
  AddOffset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Example::Referrable>,unsigned_int>>
            (_fbb,0x4a,vector_of_referrables);
  flatbuffers::FlatBufferBuilderImpl<false>::AddOffset<MyGame::InParentNamespace>
            (_fbb,0x48,parent_namespace_test);
  flatbuffers::FlatBufferBuilderImpl<false>::AddOffset<flatbuffers::Vector<double,unsigned_int>>
            (_fbb,0x46,vector_of_doubles);
  flatbuffers::FlatBufferBuilderImpl<false>::AddOffset<flatbuffers::Vector<long,unsigned_int>>
            (_fbb,0x44,vector_of_longs);
  flatbuffers::FlatBufferBuilderImpl<false>::
  AddOffset<flatbuffers::Vector<MyGame::Example::Test_const*,unsigned_int>>(_fbb,0x42,test5);
  flatbuffers::FlatBufferBuilderImpl<false>::
  AddOffset<flatbuffers::Vector<unsigned_char,unsigned_int>>(_fbb,0x40,flex);
  flatbuffers::FlatBufferBuilderImpl<false>::
  AddOffset<flatbuffers::Vector<MyGame::Example::Ability_const*,unsigned_int>>
            (_fbb,0x3e,testarrayofsortedstruct);
  flatbuffers::FlatBufferBuilderImpl<false>::
  AddOffset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,unsigned_int>>
            (_fbb,0x3c,testarrayofstring2);
  flatbuffers::FlatBufferBuilderImpl<false>::AddElement<float>(_fbb,0x3a,testf3,0.0);
  flatbuffers::FlatBufferBuilderImpl<false>::AddElement<float>(_fbb,0x38,testf2,3.0);
  flatbuffers::FlatBufferBuilderImpl<false>::AddElement<float>(_fbb,0x36,testf,3.14159);
  flatbuffers::FlatBufferBuilderImpl<false>::
  AddOffset<flatbuffers::Vector<unsigned_char,unsigned_int>>(_fbb,0x34,testarrayofbools);
  flatbuffers::FlatBufferBuilderImpl<false>::AddElement<unsigned_int>(_fbb,0x2e,testhashu32_fnv1a,0)
  ;
  flatbuffers::FlatBufferBuilderImpl<false>::AddElement<int>(_fbb,0x2c,testhashs32_fnv1a,0);
  flatbuffers::FlatBufferBuilderImpl<false>::AddElement<unsigned_int>(_fbb,0x26,testhashu32_fnv1,0);
  flatbuffers::FlatBufferBuilderImpl<false>::AddElement<int>(_fbb,0x24,testhashs32_fnv1,0);
  flatbuffers::FlatBufferBuilderImpl<false>::AddOffset<MyGame::Example::Stat>(_fbb,0x20,testempty);
  flatbuffers::FlatBufferBuilderImpl<false>::
  AddOffset<flatbuffers::Vector<unsigned_char,unsigned_int>>(_fbb,0x1e,testnestedflatbuffer);
  flatbuffers::FlatBufferBuilderImpl<false>::AddOffset<MyGame::Example::Monster>(_fbb,0x1c,enemy);
  flatbuffers::FlatBufferBuilderImpl<false>::
  AddOffset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Example::Monster>,unsigned_int>>
            (_fbb,0x1a,testarrayoftables);
  flatbuffers::FlatBufferBuilderImpl<false>::
  AddOffset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,unsigned_int>>
            (_fbb,0x18,testarrayofstring);
  flatbuffers::FlatBufferBuilderImpl<false>::
  AddOffset<flatbuffers::Vector<MyGame::Example::Test_const*,unsigned_int>>(_fbb,0x16,test4);
  flatbuffers::FlatBufferBuilderImpl<false>::AddOffset<void>(_fbb,0x14,test);
  flatbuffers::FlatBufferBuilderImpl<false>::
  AddOffset<flatbuffers::Vector<unsigned_char,unsigned_int>>(_fbb,0xe,inventory);
  flatbuffers::FlatBufferBuilderImpl<false>::AddOffset<flatbuffers::String>(_fbb,10,name);
  flatbuffers::FlatBufferBuilderImpl<false>::AddStruct<MyGame::Example::Vec3>(_fbb,4,pos);
  flatbuffers::FlatBufferBuilderImpl<false>::AddElement<short>(_fbb,8,hp,100);
  flatbuffers::FlatBufferBuilderImpl<false>::AddElement<short>(_fbb,6,mana,0x96);
  flatbuffers::FlatBufferBuilderImpl<false>::AddElement<signed_char>(_fbb,100,signed_enum,-1);
  flatbuffers::FlatBufferBuilderImpl<false>::AddElement<unsigned_char>
            (_fbb,0x5e,any_ambiguous_type,'\0');
  flatbuffers::FlatBufferBuilderImpl<false>::AddElement<unsigned_char>
            (_fbb,0x5a,any_unique_type,'\0');
  flatbuffers::FlatBufferBuilderImpl<false>::AddElement<unsigned_char>(_fbb,0x22,testbool,'\0');
  flatbuffers::FlatBufferBuilderImpl<false>::AddElement<unsigned_char>(_fbb,0x12,test_type,'\0');
  flatbuffers::FlatBufferBuilderImpl<false>::AddElement<unsigned_char>(_fbb,0x10,color,'\b');
  table.o = flatbuffers::FlatBufferBuilderImpl<false>::EndTable(_fbb,start);
  flatbuffers::FlatBufferBuilderImpl<false>::Required<MyGame::Example::Monster>(_fbb,table,10);
  return (Offset<MyGame::Example::Monster>)table.o;
}

Assistant:

inline ::flatbuffers::Offset<Monster> CreateMonster(
    ::flatbuffers::FlatBufferBuilder &_fbb,
    const MyGame::Example::Vec3 *pos = nullptr,
    int16_t mana = 150,
    int16_t hp = 100,
    ::flatbuffers::Offset<::flatbuffers::String> name = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<uint8_t>> inventory = 0,
    MyGame::Example::Color color = MyGame::Example::Color_Blue,
    MyGame::Example::Any test_type = MyGame::Example::Any_NONE,
    ::flatbuffers::Offset<void> test = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<const MyGame::Example::Test *>> test4 = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<::flatbuffers::Offset<::flatbuffers::String>>> testarrayofstring = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<::flatbuffers::Offset<MyGame::Example::Monster>>> testarrayoftables = 0,
    ::flatbuffers::Offset<MyGame::Example::Monster> enemy = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<uint8_t>> testnestedflatbuffer = 0,
    ::flatbuffers::Offset<MyGame::Example::Stat> testempty = 0,
    bool testbool = false,
    int32_t testhashs32_fnv1 = 0,
    uint32_t testhashu32_fnv1 = 0,
    int64_t testhashs64_fnv1 = 0,
    uint64_t testhashu64_fnv1 = 0,
    int32_t testhashs32_fnv1a = 0,
    uint32_t testhashu32_fnv1a = 0,
    int64_t testhashs64_fnv1a = 0,
    uint64_t testhashu64_fnv1a = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<uint8_t>> testarrayofbools = 0,
    float testf = 3.14159f,
    float testf2 = 3.0f,
    float testf3 = 0.0f,
    ::flatbuffers::Offset<::flatbuffers::Vector<::flatbuffers::Offset<::flatbuffers::String>>> testarrayofstring2 = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<const MyGame::Example::Ability *>> testarrayofsortedstruct = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<uint8_t>> flex = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<const MyGame::Example::Test *>> test5 = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<int64_t>> vector_of_longs = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<double>> vector_of_doubles = 0,
    ::flatbuffers::Offset<MyGame::InParentNamespace> parent_namespace_test = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<::flatbuffers::Offset<MyGame::Example::Referrable>>> vector_of_referrables = 0,
    uint64_t single_weak_reference = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<uint64_t>> vector_of_weak_references = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<::flatbuffers::Offset<MyGame::Example::Referrable>>> vector_of_strong_referrables = 0,
    uint64_t co_owning_reference = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<uint64_t>> vector_of_co_owning_references = 0,
    uint64_t non_owning_reference = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<uint64_t>> vector_of_non_owning_references = 0,
    MyGame::Example::AnyUniqueAliases any_unique_type = MyGame::Example::AnyUniqueAliases_NONE,
    ::flatbuffers::Offset<void> any_unique = 0,
    MyGame::Example::AnyAmbiguousAliases any_ambiguous_type = MyGame::Example::AnyAmbiguousAliases_NONE,
    ::flatbuffers::Offset<void> any_ambiguous = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<uint8_t>> vector_of_enums = 0,
    MyGame::Example::Race signed_enum = MyGame::Example::Race_None,
    ::flatbuffers::Offset<::flatbuffers::Vector<uint8_t>> testrequirednestedflatbuffer = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<::flatbuffers::Offset<MyGame::Example::Stat>>> scalar_key_sorted_tables = 0,
    const MyGame::Example::Test *native_inline = nullptr,
    MyGame::Example::LongEnum long_enum_non_enum_default = static_cast<MyGame::Example::LongEnum>(0),
    MyGame::Example::LongEnum long_enum_normal_default = MyGame::Example::LongEnum_LongOne,
    float nan_default = std::numeric_limits<float>::quiet_NaN(),
    float inf_default = std::numeric_limits<float>::infinity(),
    float positive_inf_default = std::numeric_limits<float>::infinity(),
    float infinity_default = std::numeric_limits<float>::infinity(),
    float positive_infinity_default = std::numeric_limits<float>::infinity(),
    float negative_inf_default = -std::numeric_limits<float>::infinity(),
    float negative_infinity_default = -std::numeric_limits<float>::infinity(),
    double double_inf_default = std::numeric_limits<double>::infinity()) {
  MonsterBuilder builder_(_fbb);
  builder_.add_double_inf_default(double_inf_default);
  builder_.add_long_enum_normal_default(long_enum_normal_default);
  builder_.add_long_enum_non_enum_default(long_enum_non_enum_default);
  builder_.add_non_owning_reference(non_owning_reference);
  builder_.add_co_owning_reference(co_owning_reference);
  builder_.add_single_weak_reference(single_weak_reference);
  builder_.add_testhashu64_fnv1a(testhashu64_fnv1a);
  builder_.add_testhashs64_fnv1a(testhashs64_fnv1a);
  builder_.add_testhashu64_fnv1(testhashu64_fnv1);
  builder_.add_testhashs64_fnv1(testhashs64_fnv1);
  builder_.add_negative_infinity_default(negative_infinity_default);
  builder_.add_negative_inf_default(negative_inf_default);
  builder_.add_positive_infinity_default(positive_infinity_default);
  builder_.add_infinity_default(infinity_default);
  builder_.add_positive_inf_default(positive_inf_default);
  builder_.add_inf_default(inf_default);
  builder_.add_nan_default(nan_default);
  builder_.add_native_inline(native_inline);
  builder_.add_scalar_key_sorted_tables(scalar_key_sorted_tables);
  builder_.add_testrequirednestedflatbuffer(testrequirednestedflatbuffer);
  builder_.add_vector_of_enums(vector_of_enums);
  builder_.add_any_ambiguous(any_ambiguous);
  builder_.add_any_unique(any_unique);
  builder_.add_vector_of_non_owning_references(vector_of_non_owning_references);
  builder_.add_vector_of_co_owning_references(vector_of_co_owning_references);
  builder_.add_vector_of_strong_referrables(vector_of_strong_referrables);
  builder_.add_vector_of_weak_references(vector_of_weak_references);
  builder_.add_vector_of_referrables(vector_of_referrables);
  builder_.add_parent_namespace_test(parent_namespace_test);
  builder_.add_vector_of_doubles(vector_of_doubles);
  builder_.add_vector_of_longs(vector_of_longs);
  builder_.add_test5(test5);
  builder_.add_flex(flex);
  builder_.add_testarrayofsortedstruct(testarrayofsortedstruct);
  builder_.add_testarrayofstring2(testarrayofstring2);
  builder_.add_testf3(testf3);
  builder_.add_testf2(testf2);
  builder_.add_testf(testf);
  builder_.add_testarrayofbools(testarrayofbools);
  builder_.add_testhashu32_fnv1a(testhashu32_fnv1a);
  builder_.add_testhashs32_fnv1a(testhashs32_fnv1a);
  builder_.add_testhashu32_fnv1(testhashu32_fnv1);
  builder_.add_testhashs32_fnv1(testhashs32_fnv1);
  builder_.add_testempty(testempty);
  builder_.add_testnestedflatbuffer(testnestedflatbuffer);
  builder_.add_enemy(enemy);
  builder_.add_testarrayoftables(testarrayoftables);
  builder_.add_testarrayofstring(testarrayofstring);
  builder_.add_test4(test4);
  builder_.add_test(test);
  builder_.add_inventory(inventory);
  builder_.add_name(name);
  builder_.add_pos(pos);
  builder_.add_hp(hp);
  builder_.add_mana(mana);
  builder_.add_signed_enum(signed_enum);
  builder_.add_any_ambiguous_type(any_ambiguous_type);
  builder_.add_any_unique_type(any_unique_type);
  builder_.add_testbool(testbool);
  builder_.add_test_type(test_type);
  builder_.add_color(color);
  return builder_.Finish();
}